

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void rsg::anon_unknown_0::setInfiniteRange(ValueRangeAccess valueRange)

{
  Type TVar1;
  runtime_error *this;
  long lVar2;
  VariableType *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  TVar1 = in_stack_00000008->m_baseType;
  if (TVar1 == TYPE_BOOL) {
    if (0 < in_stack_00000008->m_numElements) {
      lVar2 = 0;
      do {
        VariableType::getElementType(in_stack_00000008);
        *(undefined4 *)(in_stack_00000010 + lVar2 * 4) = 0;
        VariableType::getElementType(in_stack_00000008);
        *(undefined4 *)(in_stack_00000018 + lVar2 * 4) = 1;
        lVar2 = lVar2 + 1;
      } while (lVar2 < in_stack_00000008->m_numElements);
    }
  }
  else if (TVar1 == TYPE_INT) {
    if (0 < in_stack_00000008->m_numElements) {
      lVar2 = 0;
      do {
        VariableType::getElementType(in_stack_00000008);
        *(undefined4 *)(in_stack_00000010 + lVar2 * 4) = 0x80000000;
        VariableType::getElementType(in_stack_00000008);
        *(undefined4 *)(in_stack_00000018 + lVar2 * 4) = 0x7fffffff;
        lVar2 = lVar2 + 1;
      } while (lVar2 < in_stack_00000008->m_numElements);
    }
  }
  else {
    if (TVar1 != TYPE_FLOAT) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"setInfiniteRange(): unsupported type","");
      std::runtime_error::runtime_error(this,(string *)local_48);
      *(undefined ***)this = &PTR__runtime_error_0218a298;
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0 < in_stack_00000008->m_numElements) {
      lVar2 = 0;
      do {
        VariableType::getElementType(in_stack_00000008);
        *(undefined4 *)(in_stack_00000010 + lVar2 * 4) = 0xff800000;
        VariableType::getElementType(in_stack_00000008);
        *(undefined4 *)(in_stack_00000018 + lVar2 * 4) = 0x7f800000;
        lVar2 = lVar2 + 1;
      } while (lVar2 < in_stack_00000008->m_numElements);
    }
  }
  return;
}

Assistant:

void setInfiniteRange (ValueRangeAccess valueRange)
{
	const VariableType& type = valueRange.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<bool>();
				valueRange.getMax().component(ndx) = Scalar::max<bool>();
			}
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<int>();
				valueRange.getMax().component(ndx) = Scalar::max<int>();
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<float>();
				valueRange.getMax().component(ndx) = Scalar::max<float>();
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("setInfiniteRange(): unsupported type");
	}
}